

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

void SVGChart::MakeExamplePlot6(PPlot *ioPPlot)

{
  iterator iVar1;
  PlotDataBase *pPVar2;
  PlotDataBase *pPVar3;
  DataDrawerBase *pDVar4;
  int iVar5;
  double dVar6;
  float local_4c;
  double local_48;
  PPlot *local_40;
  PlotDataContainer *local_38;
  
  iVar5 = 0;
  local_40 = ioPPlot;
  std::__cxx11::string::_M_replace
            ((ulong)&(ioPPlot->mPlotBackground).mTitle,0,
             (char *)(ioPPlot->mPlotBackground).mTitle._M_string_length,0x10d44c);
  pPVar2 = (PlotDataBase *)operator_new(0x20);
  pPVar2->_vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[1]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[2]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[3]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00112bf0;
  pPVar3 = (PlotDataBase *)operator_new(0x20);
  pPVar3->_vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[1]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[2]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[3]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00112bf0;
  dVar6 = 0.0;
  do {
    local_4c = (float)(dVar6 * 0.001 + 0.0001);
    iVar1._M_current = (float *)pPVar2[2]._vptr_PlotDataBase;
    if ((_func_int **)iVar1._M_current == pPVar2[3]._vptr_PlotDataBase) {
      local_48 = dVar6;
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)(pPVar2 + 1),iVar1,&local_4c);
      dVar6 = local_48;
    }
    else {
      *iVar1._M_current = local_4c;
      pPVar2[2]._vptr_PlotDataBase = (_func_int **)(iVar1._M_current + 1);
    }
    local_4c = (float)iVar5 * 0.0001 * (float)iVar5 + 0.01;
    iVar1._M_current = (float *)pPVar3[2]._vptr_PlotDataBase;
    if ((_func_int **)iVar1._M_current == pPVar3[3]._vptr_PlotDataBase) {
      local_48 = dVar6;
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)(pPVar3 + 1),iVar1,&local_4c);
      dVar6 = local_48;
    }
    else {
      *iVar1._M_current = local_4c;
      pPVar3[2]._vptr_PlotDataBase = (_func_int **)(iVar1._M_current + 1);
    }
    dVar6 = dVar6 + 1.0;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0xb);
  pDVar4 = (DataDrawerBase *)operator_new(0xa8);
  pDVar4->mXTrafo = (Trafo *)0x0;
  pDVar4->mYTrafo = (Trafo *)0x0;
  iVar5 = 0;
  pDVar4->mDrawFast = false;
  pDVar4->mPlotCount = 1;
  pDVar4->mPlotIndex = 0;
  pDVar4->_vptr_DataDrawerBase = (_func_int **)&PTR__LineDataDrawer_00112818;
  *(undefined2 *)&pDVar4->field_0x24 = 0x101;
  *(undefined4 *)&pDVar4[1]._vptr_DataDrawerBase = 10;
  pDVar4[1].mXTrafo = (Trafo *)&pDVar4[1].mDrawFast;
  pDVar4[1].mYTrafo = (Trafo *)0x0;
  pDVar4[1].mDrawFast = false;
  pDVar4[2].mXTrafo = (Trafo *)&pDVar4[2].mDrawFast;
  pDVar4[2].mYTrafo = (Trafo *)0x0;
  pDVar4[2].mDrawFast = false;
  *(undefined4 *)&pDVar4[3].mXTrafo = 0;
  pDVar4[3].mYTrafo = (Trafo *)0x0;
  *(Trafo ***)&pDVar4[3].mDrawFast = &pDVar4[3].mXTrafo;
  *(Trafo ***)&pDVar4[3].mPlotIndex = &pDVar4[3].mXTrafo;
  pDVar4[4]._vptr_DataDrawerBase = (_func_int **)0x0;
  *(undefined4 *)&pDVar4[2]._vptr_DataDrawerBase = 3;
  local_38 = &local_40->mPlotDataContainer;
  PlotDataContainer::AddXYPlot
            (local_38,pPVar2,pPVar3,(LegendData *)0x0,pDVar4,(PlotDataSelection *)0x0);
  pPVar2 = (PlotDataBase *)operator_new(0x20);
  pPVar2->_vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[1]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[2]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[3]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00112bf0;
  pPVar3 = (PlotDataBase *)operator_new(0x20);
  pPVar3->_vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[1]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[2]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[3]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00112bf0;
  dVar6 = 0.0;
  do {
    local_4c = (float)(dVar6 * 0.001 + 0.0001);
    iVar1._M_current = (float *)pPVar2[2]._vptr_PlotDataBase;
    if ((_func_int **)iVar1._M_current == pPVar2[3]._vptr_PlotDataBase) {
      local_48 = dVar6;
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)(pPVar2 + 1),iVar1,&local_4c);
      dVar6 = local_48;
    }
    else {
      *iVar1._M_current = local_4c;
      pPVar2[2]._vptr_PlotDataBase = (_func_int **)(iVar1._M_current + 1);
    }
    local_4c = (float)iVar5 * -0.0001 * (float)iVar5 + 0.2;
    iVar1._M_current = (float *)pPVar3[2]._vptr_PlotDataBase;
    if ((_func_int **)iVar1._M_current == pPVar3[3]._vptr_PlotDataBase) {
      local_48 = dVar6;
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)(pPVar3 + 1),iVar1,&local_4c);
      dVar6 = local_48;
    }
    else {
      *iVar1._M_current = local_4c;
      pPVar3[2]._vptr_PlotDataBase = (_func_int **)(iVar1._M_current + 1);
    }
    dVar6 = dVar6 + 1.0;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0xb);
  pDVar4 = (DataDrawerBase *)operator_new(0xa8);
  pDVar4->mXTrafo = (Trafo *)0x0;
  pDVar4->mYTrafo = (Trafo *)0x0;
  pDVar4->mDrawFast = false;
  pDVar4->mPlotCount = 1;
  pDVar4->mPlotIndex = 0;
  pDVar4->_vptr_DataDrawerBase = (_func_int **)&PTR__LineDataDrawer_00112818;
  *(undefined4 *)&pDVar4[1]._vptr_DataDrawerBase = 10;
  pDVar4[1].mXTrafo = (Trafo *)&pDVar4[1].mDrawFast;
  pDVar4[1].mYTrafo = (Trafo *)0x0;
  pDVar4[1].mDrawFast = false;
  *(undefined4 *)&pDVar4[2]._vptr_DataDrawerBase = 1;
  pDVar4[2].mXTrafo = (Trafo *)&pDVar4[2].mDrawFast;
  pDVar4[2].mYTrafo = (Trafo *)0x0;
  pDVar4[2].mDrawFast = false;
  *(undefined4 *)&pDVar4[3].mXTrafo = 0;
  pDVar4[3].mYTrafo = (Trafo *)0x0;
  *(Trafo ***)&pDVar4[3].mDrawFast = &pDVar4[3].mXTrafo;
  *(Trafo ***)&pDVar4[3].mPlotIndex = &pDVar4[3].mXTrafo;
  pDVar4[4]._vptr_DataDrawerBase = (_func_int **)0x0;
  *(undefined2 *)&pDVar4->field_0x24 = 0;
  pDVar4->field_0x25 = 1;
  PlotDataContainer::AddXYPlot
            (local_38,pPVar2,pPVar3,(LegendData *)0x0,pDVar4,(PlotDataSelection *)0x0);
  (local_40->mMargins).mLeft = 0x32;
  (local_40->mMargins).mTop = 0x14;
  return;
}

Assistant:

void MakeExamplePlot6 (PPlot &ioPPlot) {

      int theI;

      ioPPlot.mPlotBackground.mTitle = "line styles";
      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 100.0f/(100*100*100);
      for (theI=0;theI<=10;theI++) {
        theX1->push_back (0.0001+theI*0.001);
        theY1->push_back (0.01+theFac*theI*theI);
      }
      LineDataDrawer *theDataDrawer1 = new LineDataDrawer ();
      theDataDrawer1->mDrawPoint = true;
      theDataDrawer1->mStyle.mPenWidth = 3;
      ioPPlot.mPlotDataContainer.AddXYPlot (theX1, theY1, nullptr, theDataDrawer1);

      PlotData *theX2 = new PlotData ();
      PlotData *theY2 = new PlotData ();
      for (theI=0;theI<=10;theI++) {
        theX2->push_back (0.0001+theI*0.001);
        theY2->push_back (0.2-theFac*theI*theI);
      }
      LineDataDrawer *theDataDrawer2 = new LineDataDrawer ();
      theDataDrawer2->mDrawPoint = true;
      theDataDrawer2->mDrawLine = false;
      ioPPlot.mPlotDataContainer.AddXYPlot (theX2, theY2, nullptr, theDataDrawer2);

      ioPPlot.mMargins.mLeft = 50;
      ioPPlot.mMargins.mTop = 20;
    }